

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O2

Mesh * eos::morphablemodel::sample_to_mesh
                 (Mesh *__return_storage_ptr__,VectorXf *shape_instance,VectorXf *color_instance,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tvi,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tci,
                 vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 *texture_coordinates,
                 vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                 *texture_triangle_indices)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  pointer paVar7;
  pointer paVar8;
  pointer pMVar9;
  size_type __new_size;
  CoeffReturnType pfVar10;
  CoeffReturnType pfVar11;
  CoeffReturnType pfVar12;
  ulong uVar13;
  size_type sVar14;
  long lVar15;
  size_type sVar16;
  bool bVar17;
  uint uVar18;
  DenseStorage<float,_2,_2,_1,_0> DVar19;
  
  lVar15 = (shape_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage
           .m_rows;
  lVar6 = (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  if (lVar6 != 0 && lVar15 != lVar6) {
    __assert_fail("shape_instance.rows() == color_instance.rows() || color_instance.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x25c,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  paVar7 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  paVar8 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __new_size = lVar15 / 3;
  if (((paVar7 != paVar8) && ((long)paVar7 - (long)paVar8 >> 4 != __new_size)) &&
     ((texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (texture_triangle_indices->
      super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    __assert_fail("texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) || !texture_triangle_indices .empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/MorphableModel.hpp"
                  ,0x261,
                  "core::Mesh eos::morphablemodel::sample_to_mesh(const Eigen::VectorXf &, const Eigen::VectorXf &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<int, 3>> &, const std::vector<std::array<double, 2>> &, const std::vector<std::array<int, 3>> &)"
                 );
  }
  memset(__return_storage_ptr__,0,0x90);
  std::
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::resize(&__return_storage_ptr__->vertices,__new_size);
  sVar14 = 0;
  if (0 < (long)__new_size) {
    sVar14 = __new_size;
  }
  lVar15 = 1;
  sVar16 = sVar14;
  while (bVar17 = sVar16 != 0, sVar16 = sVar16 - 1, bVar17) {
    pfVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)shape_instance
                         ,lVar15 + -1);
    pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)shape_instance
                         ,lVar15);
    pfVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)shape_instance
                         ,lVar15 + 1);
    fVar2 = *pfVar11;
    fVar3 = *pfVar12;
    pMVar9 = (__return_storage_ptr__->vertices).
             super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(float *)((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                      m_storage + lVar15 * 4 + -4) = *pfVar10;
    *(float *)((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                      m_storage + lVar15 * 4) = fVar2;
    *(float *)((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                      m_storage + lVar15 * 4 + 4) = fVar3;
    lVar15 = lVar15 + 3;
  }
  if (0 < (color_instance->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows) {
    std::
    vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
    ::resize(&__return_storage_ptr__->colors,__new_size);
    lVar15 = 1;
    while (bVar17 = sVar14 != 0, sVar14 = sVar14 - 1, bVar17) {
      pfVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           color_instance,lVar15 + -1);
      fVar2 = *pfVar10;
      pfVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           color_instance,lVar15);
      fVar3 = *pfVar11;
      pfVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_0>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0> *)
                           color_instance,lVar15 + 1);
      uVar18 = -(uint)(1.0 < fVar2);
      pMVar9 = (__return_storage_ptr__->colors).
               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fVar4 = *pfVar11;
      fVar5 = *pfVar12;
      *(uint *)((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar15 * 4 + -4) =
           ~-(uint)(fVar2 < 0.0) & (~uVar18 & (uint)*pfVar10 | uVar18 & 0x3f800000);
      uVar18 = -(uint)(1.0 < fVar3);
      *(ulong *)((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar15 * 4) =
           CONCAT44(-(uint)(0.0 <= fVar5) &
                    (~-(uint)(1.0 < fVar5) & (uint)fVar5 | -(uint)(1.0 < fVar5) & 0x3f800000),
                    -(uint)(0.0 <= fVar3) & (~uVar18 & (uint)fVar4 | uVar18 & 0x3f800000));
      lVar15 = lVar15 + 3;
    }
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tvi,tvi);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
            (&__return_storage_ptr__->tci,tci);
  paVar7 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  paVar8 = (texture_coordinates->
           super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (paVar7 != paVar8) {
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::resize(&__return_storage_ptr__->texcoords,(long)paVar8 - (long)paVar7 >> 4);
    lVar15 = 0;
    for (uVar13 = 0;
        paVar7 = (texture_coordinates->
                 super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar13 < (ulong)((long)(texture_coordinates->
                               super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)paVar7 >> 4);
        uVar13 = uVar13 + 1) {
      pdVar1 = (double *)((long)paVar7->_M_elems + lVar15);
      DVar19.m_data.array[0] = (float)*pdVar1;
      DVar19.m_data.array[1] = (float)pdVar1[1];
      (__return_storage_ptr__->texcoords).
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar13].
      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data =
           DVar19.m_data.array;
      lVar15 = lVar15 + 0x10;
    }
    if ((texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        (texture_triangle_indices->
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator=
                (&__return_storage_ptr__->tti,texture_triangle_indices);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline core::Mesh sample_to_mesh(
    const Eigen::VectorXf& shape_instance, const Eigen::VectorXf& color_instance,
    const std::vector<std::array<int, 3>>& tvi, const std::vector<std::array<int, 3>>& tci,
    const std::vector<std::array<double, 2>>&
        texture_coordinates /* = std::vector<std::array<double, 2>>() */,
    const std::vector<std::array<int, 3>>& texture_triangle_indices /* = std::vector<std::array<int, 3>>() */)
{
    assert(shape_instance.rows() == color_instance.rows() ||
           color_instance.size() == 0); // The number of vertices (= model.getDataDimension() / 3) has to be
                                        // equal for both models, or, alternatively, it has to be a shape-only
                                        // model.
    assert(texture_coordinates.size() == 0 || texture_coordinates.size() == (shape_instance.rows() / 3) ||
           !texture_triangle_indices
                .empty()); // No texture coordinates are ok. If there are texture
                           // coordinates given, their number needs to be identical to the
                           // number of vertices, or texture_triangle_indices needs to be given.

    const auto num_vertices = shape_instance.rows() / 3;

    core::Mesh mesh;

    // Construct the mesh vertices:
    mesh.vertices.resize(num_vertices);
    for (auto i = 0; i < num_vertices; ++i)
    {
        mesh.vertices[i] = Eigen::Vector3f(
            shape_instance(i * 3 + 0), shape_instance(i * 3 + 1),
            shape_instance(i * 3 + 2)); // Note: This can probably be simplified now, Eigen on both sides!
    }

    // Assign the vertex colour information if it's not a shape-only model:
    if (color_instance.size() > 0)
    {
        mesh.colors.resize(num_vertices);
        for (auto i = 0; i < num_vertices; ++i)
        {
            mesh.colors[i] = Eigen::Vector3f(
                cpp17::clamp(color_instance(i * 3 + 0), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 1), 0.0f, 1.0f),
                cpp17::clamp(color_instance(i * 3 + 2), 0.0f, 1.0f)); // We use RGB order everywhere.
        }
    }

    // Assign the triangle lists:
    mesh.tvi = tvi;
    mesh.tci = tci; // tci will be empty in case of a shape-only model

    // Texture coordinates, if the model has them:
    if (!texture_coordinates.empty())
    {
        mesh.texcoords.resize(texture_coordinates.size());
        for (auto i = 0; i < texture_coordinates.size(); ++i)
        {
            mesh.texcoords[i] = Eigen::Vector2f(texture_coordinates[i][0], texture_coordinates[i][1]);
        }
        if (!texture_triangle_indices.empty())
        {
            mesh.tti = texture_triangle_indices;
        }
    }

    return mesh;
}